

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_registering_subjects_provides_those_subjects_Test
::
~SubjectSetRegisterTest_next_subscription_sync_after_registering_subjects_provides_those_subjects_Test
          (SubjectSetRegisterTest_next_subscription_sync_after_registering_subjects_provides_those_subjects_Test
           *this)

{
  SubjectSetRegisterTest_next_subscription_sync_after_registering_subjects_provides_those_subjects_Test
  *this_local;
  
  ~SubjectSetRegisterTest_next_subscription_sync_after_registering_subjects_provides_those_subjects_Test
            (this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_registering_subjects_provides_those_subjects)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT1, false);
    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    ASSERT_TRUE(message);
    std::vector<Subject> set_comparison = {SS_SUBJECT0, SS_SUBJECT1};
    EXPECT_EQ(set_comparison, message->GetSubjects());
}